

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2test.c
# Opt level: O2

int ord2utf8(uint32_t cvalue,uint8_t *utf8bytes)

{
  uint uVar1;
  long lVar2;
  ulong uVar3;
  int *piVar4;
  
  piVar4 = utf8_table1;
  lVar2 = 0;
  uVar1 = 6;
  do {
    if (lVar2 == 6) {
LAB_0010a4d2:
      for (uVar3 = (ulong)uVar1; 0 < (int)uVar3; uVar3 = uVar3 - 1) {
        utf8bytes[uVar3] = (byte)cvalue & 0x3f | 0x80;
        cvalue = cvalue >> 6;
      }
      *utf8bytes = (byte)cvalue | (byte)utf8_table2[uVar1];
      return uVar1 + 1;
    }
    if (cvalue <= (uint)*piVar4) {
      uVar1 = (uint)lVar2;
      goto LAB_0010a4d2;
    }
    lVar2 = lVar2 + 1;
    piVar4 = (int *)((uint *)piVar4 + 1);
  } while( true );
}

Assistant:

static int
ord2utf8(uint32_t cvalue, uint8_t *utf8bytes)
{
register int i, j;
if (cvalue > 0x7fffffffu)
  return -1;
for (i = 0; i < utf8_table1_size; i++)
  if (cvalue <= (uint32_t)utf8_table1[i]) break;
utf8bytes += i;
for (j = i; j > 0; j--)
 {
 *utf8bytes-- = 0x80 | (cvalue & 0x3f);
 cvalue >>= 6;
 }
*utf8bytes = utf8_table2[i] | cvalue;
return i + 1;
}